

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void commit_x4(uint8_t **digest,uint8_t **seed,uint8_t *salt,size_t t,size_t j,
              picnic_instance_t *params)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short in_R8W;
  uint16_t j_arr [4];
  hash_context_x4 ctx;
  undefined6 in_stack_fffffffffffffc88;
  uint16_t in_stack_fffffffffffffc8e;
  undefined2 in_stack_fffffffffffffc90;
  undefined2 in_stack_fffffffffffffc92;
  undefined2 in_stack_fffffffffffffc94;
  undefined2 in_stack_fffffffffffffc96;
  size_t in_stack_fffffffffffffca0;
  uint8_t *in_stack_fffffffffffffca8;
  hash_context_x4 *in_stack_fffffffffffffcb0;
  
  hash_init_x4((hash_context_x4 *)
               CONCAT26(in_stack_fffffffffffffc96,
                        CONCAT24(in_stack_fffffffffffffc94,
                                 CONCAT22(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90))),
               CONCAT26(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88));
  hash_update_x4((hash_context_x4 *)
                 CONCAT26(in_stack_fffffffffffffc96,
                          CONCAT24(in_stack_fffffffffffffc94,
                                   CONCAT22(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90))),
                 (uint8_t **)CONCAT26(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88),0x146b7f)
  ;
  hash_update_x4_1(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  hash_update_x4_uint16_le
            ((hash_context_x4 *)
             CONCAT26(in_stack_fffffffffffffc96,
                      CONCAT24(in_stack_fffffffffffffc94,
                               CONCAT22(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90))),
             in_stack_fffffffffffffc8e);
  sVar1 = in_R8W + 1;
  sVar2 = in_R8W + 2;
  sVar3 = in_R8W + 3;
  hash_update_x4_uint16s_le
            ((hash_context_x4 *)CONCAT26(sVar3,CONCAT24(sVar2,CONCAT22(sVar1,in_R8W))),
             (uint16_t *)CONCAT26(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88));
  hash_final_x4((hash_context_x4 *)0x146c08);
  hash_squeeze_x4((hash_context_x4 *)CONCAT26(sVar3,CONCAT24(sVar2,CONCAT22(sVar1,in_R8W))),
                  (uint8_t **)CONCAT26(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88),0x146c28
                 );
  return;
}

Assistant:

static void commit_x4(uint8_t** digest, const uint8_t** seed, const uint8_t* salt, size_t t,
                      size_t j, const picnic_instance_t* params) {
  /* Compute C[t][j];  as digest = H(seed||[aux]) aux is optional */
  hash_context_x4 ctx;

  hash_init_x4(&ctx, params->digest_size);
  hash_update_x4(&ctx, seed, params->seed_size);
  hash_update_x4_1(&ctx, salt, SALT_SIZE);
  hash_update_x4_uint16_le(&ctx, t);
  const uint16_t j_arr[4] = {j + 0, j + 1, j + 2, j + 3};
  hash_update_x4_uint16s_le(&ctx, j_arr);
  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx, digest, params->digest_size);
  hash_clear_x4(&ctx);
}